

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O0

shared_ptr<vmips::VirtReg> __thiscall
vmips::CFGNode::append<vmips::lw,std::shared_ptr<vmips::MemoryLocation>>
          (CFGNode *this,shared_ptr<vmips::MemoryLocation> *args)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<vmips::VirtReg> sVar2;
  shared_ptr<vmips::Instruction> local_58 [2];
  undefined1 local_38 [8];
  shared_ptr<vmips::lw> instr;
  shared_ptr<vmips::MemoryLocation> *args_local;
  CFGNode *this_local;
  shared_ptr<vmips::VirtReg> *ret;
  
  instr.super___shared_ptr<vmips::lw,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  vmips::VirtReg::create();
  std::
  make_shared<vmips::lw,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::MemoryLocation>>
            ((shared_ptr<vmips::VirtReg> *)local_38,(shared_ptr<vmips::MemoryLocation> *)this);
  std::shared_ptr<vmips::Instruction>::shared_ptr<vmips::lw,void>
            (local_58,(shared_ptr<vmips::lw> *)local_38);
  std::
  vector<std::shared_ptr<vmips::Instruction>,_std::allocator<std::shared_ptr<vmips::Instruction>_>_>
  ::push_back((vector<std::shared_ptr<vmips::Instruction>,_std::allocator<std::shared_ptr<vmips::Instruction>_>_>
               *)(args + 3),local_58);
  std::shared_ptr<vmips::Instruction>::~shared_ptr(local_58);
  instr.super___shared_ptr<vmips::lw,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 1;
  std::shared_ptr<vmips::lw>::~shared_ptr((shared_ptr<vmips::lw> *)local_38);
  _Var1._M_pi = extraout_RDX;
  if ((instr.super___shared_ptr<vmips::lw,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ & 1)
      == 0) {
    std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)this);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<vmips::VirtReg>)
         sVar2.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<VirtReg> append(Args &&...args) {
            auto ret = VirtReg::create();
            auto instr = std::make_shared<Instr>(ret, std::forward<Args>(args)...);
            instructions.push_back(instr);
            return ret;
        }